

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::
ParseFieldWithExtensionInfo<google::protobuf::internal::InternalMetadataWithArenaLite>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadataWithArenaLite *metadata,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  float value;
  unsigned_long uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<const_char_*,_unsigned_long> pVar8;
  pair<const_char_*,_unsigned_long> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_unsigned_long> pVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  bool bVar14;
  int iVar15;
  LogMessage *other;
  string *s;
  MessageLite *pMVar16;
  void *pvVar17;
  char *pcVar18;
  Extension *pEVar19;
  undefined4 extraout_var;
  uint size;
  undefined7 in_register_00000011;
  FieldType FVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  uint32 uVar21;
  FieldDescriptor *pFVar22;
  ulong uVar23;
  pair<const_char_*,_int> pVar24;
  pair<const_char_*,_unsigned_long> pVar25;
  pair<const_char_*,_unsigned_long> pVar26;
  pair<const_char_*,_unsigned_long> pVar27;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar28;
  pair<const_char_*,_unsigned_long> pVar29;
  LogFinisher local_71;
  double local_70;
  LogMessage local_68;
  
  iVar15 = extension->type - 1;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(iVar15) {
    case 0:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x01',extension->is_packed,extension->descriptor);
      pcVar18 = PackedDoubleParser(pvVar17,ptr,ctx);
      return pcVar18;
    case 1:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x02',extension->is_packed,extension->descriptor);
      pcVar18 = PackedFloatParser(pvVar17,ptr,ctx);
      return pcVar18;
    case 2:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x03',extension->is_packed,extension->descriptor);
      pcVar18 = PackedInt64Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 3:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x04',extension->is_packed,extension->descriptor);
      pcVar18 = PackedUInt64Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 4:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x05',extension->is_packed,extension->descriptor);
      pcVar18 = PackedInt32Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 5:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x06',extension->is_packed,extension->descriptor);
      pcVar18 = PackedFixed64Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 6:
      pvVar17 = MutableRawRepeatedField(this,number,'\a',extension->is_packed,extension->descriptor)
      ;
      pcVar18 = PackedFixed32Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 7:
      pvVar17 = MutableRawRepeatedField(this,number,'\b',extension->is_packed,extension->descriptor)
      ;
      pcVar18 = PackedBoolParser(pvVar17,ptr,ctx);
      return pcVar18;
    case 8:
    case 9:
    case 10:
    case 0xb:
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4e);
      other = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_71,other);
      LogMessage::~LogMessage(&local_68);
      return ptr;
    case 0xc:
      pvVar17 = MutableRawRepeatedField(this,number,'\r',extension->is_packed,extension->descriptor)
      ;
      pcVar18 = PackedUInt32Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 0xd:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x0e',extension->is_packed,extension->descriptor);
      pcVar18 = PackedEnumParserArg(pvVar17,ptr,ctx,
                                    (_func_bool_void_ptr_int *)
                                    (extension->field_3).enum_validity_check.func,
                                    (extension->field_3).enum_validity_check.arg,metadata,number);
      return pcVar18;
    case 0xe:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x0f',extension->is_packed,extension->descriptor);
      pcVar18 = PackedSFixed32Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 0xf:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x10',extension->is_packed,extension->descriptor);
      pcVar18 = PackedSFixed64Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 0x10:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x11',extension->is_packed,extension->descriptor);
      pcVar18 = PackedSInt32Parser(pvVar17,ptr,ctx);
      return pcVar18;
    case 0x11:
      pvVar17 = MutableRawRepeatedField
                          (this,number,'\x12',extension->is_packed,extension->descriptor);
      pcVar18 = PackedSInt64Parser(pvVar17,ptr,ctx);
      return pcVar18;
    default:
      return ptr;
    }
  }
  switch(iVar15) {
  case 0:
    local_70 = *(double *)ptr;
    ptr = ptr + 8;
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,local_70,extension->descriptor);
    }
    else {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\x01';
        pEVar19->is_repeated = false;
      }
      pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
      (pEVar19->field_0).double_value = local_70;
    }
    break;
  case 1:
    value = *(float *)ptr;
    ptr = ptr + 4;
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,value,extension->descriptor);
    }
    else {
      local_70 = (double)CONCAT44(local_70._4_4_,value);
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\x02';
        pEVar19->is_repeated = false;
      }
      pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
      (pEVar19->field_0).int32_value = local_70._0_4_;
    }
    break;
  case 2:
    bVar3 = *ptr;
    pVar26.second = (long)(char)bVar3;
    pVar26.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar26 = VarintParseSlow64(ptr,uVar21);
        if (pVar26.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        pVar26.second._0_4_ = uVar21;
        pVar26.first = ptr + 2;
        pVar26.second._4_4_ = 0;
      }
    }
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\x03';
LAB_0038dd77:
      AddInt64(this,number,FVar20,bVar14,pVar26.second,pFVar22);
      return pVar26.first;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x03';
      pEVar19->is_repeated = false;
    }
    goto LAB_0038dda3;
  case 3:
    bVar3 = *ptr;
    pVar26.second = (long)(char)bVar3;
    pVar26.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar26 = VarintParseSlow64(ptr,uVar21);
        if (pVar26.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        pVar26.second._0_4_ = uVar21;
        pVar26.first = ptr + 2;
        pVar26.second._4_4_ = 0;
      }
    }
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\x04';
LAB_0038dd04:
      AddUInt64(this,number,FVar20,bVar14,pVar26.second,pFVar22);
      return pVar26.first;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x04';
      pEVar19->is_repeated = false;
    }
    goto LAB_0038dda3;
  case 4:
    bVar3 = *ptr;
    auVar7._8_8_ = (long)(char)bVar3;
    auVar7._0_8_ = ptr + 1;
    auVar12 = auVar7._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar27 = VarintParseSlow64(ptr,uVar21);
        auVar12 = pVar27._0_12_;
        if (pVar27.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        auVar12._8_4_ = uVar21;
        auVar12._0_8_ = ptr + 2;
      }
    }
    ptr = auVar12._0_8_;
    uVar21 = auVar12._8_4_;
    if (extension->is_repeated != true) {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\x05';
        pEVar19->is_repeated = false;
      }
      goto LAB_0038de38;
    }
    bVar14 = extension->is_packed;
    pFVar22 = extension->descriptor;
    FVar20 = '\x05';
    goto LAB_0038dc3b;
  case 5:
    uVar5 = *(unsigned_long *)ptr;
    pcVar18 = ptr + 8;
    pVar26.second = uVar5;
    pVar26.first = pcVar18;
    pVar11.second = uVar5;
    pVar11.first = pcVar18;
    pVar10.second = uVar5;
    pVar10.first = pcVar18;
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\x06';
      goto LAB_0038dd04;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    pVar26 = pVar10;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x06';
      pEVar19->is_repeated = false;
      pVar26 = pVar11;
    }
    goto LAB_0038dda3;
  case 6:
    uVar21 = *(uint32 *)ptr;
    if (extension->is_repeated != true) {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\a';
        pEVar19->is_repeated = false;
      }
LAB_0038da13:
      pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
      (pEVar19->field_0).int32_value = uVar21;
      return ptr + 4;
    }
    bVar14 = extension->is_packed;
    pFVar22 = extension->descriptor;
    FVar20 = '\a';
    ptr = ptr + 4;
LAB_0038dbd1:
    AddUInt32(this,number,FVar20,bVar14,uVar21,pFVar22);
    break;
  case 7:
    bVar3 = *ptr;
    ptr = ptr + 1;
    if (extension->is_repeated == true) {
      AddBool(this,number,'\b',extension->is_packed,(bool)(bVar3 & 1),extension->descriptor);
    }
    else {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\b';
        pEVar19->is_repeated = false;
      }
      pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
      (pEVar19->field_0).bool_value = (bool)(bVar3 & 1);
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar3 = *ptr;
    size = (uint)bVar3;
    if (-1 < (char)bVar3) {
      pcVar18 = ptr + 1;
LAB_0038d82c:
      pcVar18 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar18,size,s);
      return pcVar18;
    }
    pVar24 = ReadSizeFallback(ptr,(uint)bVar3);
    size = pVar24.second;
    pcVar18 = pVar24.first;
    if (pcVar18 != (char *)0x0) goto LAB_0038d82c;
    goto LAB_0038ddfb;
  case 9:
    pMVar16 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar16 = AddMessage(this,number,'\n',pMVar16,extension->descriptor);
    }
    else {
      pMVar16 = MutableMessage(this,number,'\n',pMVar16,extension->descriptor);
    }
    iVar15 = ctx->depth_;
    ctx->depth_ = iVar15 + -1;
    if (0 < iVar15) {
      ctx->group_depth_ = ctx->group_depth_ + 1;
      iVar15 = (*pMVar16->_vptr_MessageLite[0xd])(pMVar16,ptr,ctx);
      uVar1 = ctx->depth_;
      uVar2 = ctx->group_depth_;
      ctx->depth_ = uVar1 + 1;
      ctx->group_depth_ = uVar2 + -1;
      uVar21 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar21 != number * 8 + 3U) {
        return (char *)0x0;
      }
      return (char *)CONCAT44(extraout_var,iVar15);
    }
LAB_0038ddfb:
    ptr = (char *)0x0;
    break;
  case 10:
    pMVar16 = (MessageLite *)(extension->field_3).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar16 = AddMessage(this,number,'\v',pMVar16,extension->descriptor);
    }
    else {
      pMVar16 = MutableMessage(this,number,'\v',pMVar16,extension->descriptor);
    }
    pcVar18 = ParseContext::ParseMessage(ctx,pMVar16,ptr);
    return pcVar18;
  case 0xc:
    bVar3 = *ptr;
    auVar6._8_8_ = (long)(char)bVar3;
    auVar6._0_8_ = ptr + 1;
    auVar12 = auVar6._0_12_;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar27 = VarintParseSlow64(ptr,uVar21);
        auVar12 = pVar27._0_12_;
        if (pVar27.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        auVar12._8_4_ = uVar21;
        auVar12._0_8_ = ptr + 2;
      }
    }
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\r';
      uVar21 = auVar12._8_4_;
      ptr = auVar12._0_8_;
      goto LAB_0038dbd1;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\r';
      pEVar19->is_repeated = false;
    }
    goto LAB_0038de38;
  case 0xd:
    bVar3 = *ptr;
    pVar29.second = (long)(char)bVar3;
    pVar29.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar29 = VarintParseSlow64(ptr,uVar21);
        if (pVar29.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        pVar29.second._0_4_ = uVar21;
        pVar29.first = ptr + 2;
        pVar29.second._4_4_ = 0;
      }
    }
    auVar12 = pVar29._0_12_;
    bVar14 = (*(extension->field_3).enum_validity_check.func)
                       ((extension->field_3).enum_validity_check.arg,(int)pVar29.second);
    if (!bVar14) {
      if ((*(ulong *)metadata & 1) == 0) {
        s_00 = InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ::mutable_unknown_fields_slow
                         ((InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                           *)metadata);
      }
      else {
        s_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(ulong *)metadata & 0xfffffffffffffffe);
      }
      WriteVarint(number,pVar29.second,s_00);
      return pVar29.first;
    }
    if (extension->is_repeated == true) {
      AddEnum(this,number,'\x0e',extension->is_packed,(int)pVar29.second,extension->descriptor);
      return pVar29.first;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x0e';
      pEVar19->is_repeated = false;
    }
LAB_0038de38:
    ptr = auVar12._0_8_;
    pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
    (pEVar19->field_0).int32_value = auVar12._8_4_;
    break;
  case 0xe:
    uVar21 = *(uint32 *)ptr;
    if (extension->is_repeated != true) {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\x0f';
        pEVar19->is_repeated = false;
      }
      goto LAB_0038da13;
    }
    bVar14 = extension->is_packed;
    pFVar22 = extension->descriptor;
    FVar20 = '\x0f';
    ptr = ptr + 4;
    goto LAB_0038dc3b;
  case 0xf:
    pVar9.second = *(unsigned_long *)ptr;
    pVar9.first = ptr + 8;
    pVar26.second = *(unsigned_long *)ptr;
    pVar26.first = ptr + 8;
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\x10';
      pVar26 = pVar9;
      goto LAB_0038dd77;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x10';
      pEVar19->is_repeated = false;
      pVar26 = pVar9;
    }
    goto LAB_0038dda3;
  case 0x10:
    bVar3 = *ptr;
    pVar25.second = (long)(char)bVar3;
    pVar25.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar25 = VarintParseSlow64(ptr,uVar21);
        if (pVar25.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        pVar25.second._0_4_ = uVar21;
        pVar25.first = ptr + 2;
        pVar25.second._4_4_ = 0;
      }
    }
    ptr = pVar25.first;
    uVar21 = -((uint)pVar25.second & 1) ^ (uint)(pVar25.second >> 1) & 0x7fffffff;
    auVar13._8_4_ = uVar21;
    auVar13._0_8_ = ptr;
    auVar12._8_4_ = uVar21;
    auVar12._0_8_ = ptr;
    if (extension->is_repeated != true) {
      pFVar22 = extension->descriptor;
      pVar28 = Insert(this,number);
      pEVar19 = pVar28.first;
      pEVar19->descriptor = pFVar22;
      if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pEVar19->type = '\x11';
        pEVar19->is_repeated = false;
        auVar12 = auVar13;
      }
      goto LAB_0038de38;
    }
    bVar14 = extension->is_packed;
    pFVar22 = extension->descriptor;
    FVar20 = '\x11';
LAB_0038dc3b:
    AddInt32(this,number,FVar20,bVar14,uVar21,pFVar22);
    break;
  case 0x11:
    bVar3 = *ptr;
    pVar27.second = (long)(char)bVar3;
    pVar27.first = ptr + 1;
    if ((long)(char)bVar3 < 0) {
      bVar4 = ptr[1];
      uVar21 = ((uint)bVar3 + (uint)bVar4 * 0x80) - 0x80;
      if ((char)bVar4 < '\0') {
        pVar27 = VarintParseSlow64(ptr,uVar21);
        if (pVar27.first == (char *)0x0) goto LAB_0038ddfb;
      }
      else {
        pVar27.second._0_4_ = uVar21;
        pVar27.first = ptr + 2;
        pVar27.second._4_4_ = 0;
      }
    }
    uVar23 = -(ulong)((uint)pVar27.second & 1) ^ pVar27.second >> 1;
    pVar8.second = uVar23;
    pVar8.first = pVar27.first;
    pVar26.second = uVar23;
    pVar26.first = pVar27.first;
    if (extension->is_repeated == true) {
      bVar14 = extension->is_packed;
      pFVar22 = extension->descriptor;
      FVar20 = '\x12';
      pVar26 = pVar8;
      goto LAB_0038dd77;
    }
    pFVar22 = extension->descriptor;
    pVar28 = Insert(this,number);
    pEVar19 = pVar28.first;
    pEVar19->descriptor = pFVar22;
    if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar19->type = '\x12';
      pEVar19->is_repeated = false;
      pVar26 = pVar8;
    }
LAB_0038dda3:
    ptr = pVar26.first;
    pEVar19->field_0xa = pEVar19->field_0xa & 0xf0;
    (pEVar19->field_0).int64_value = pVar26.second;
  }
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    T* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 value;                                                           \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64 val;                                                             \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
      HANDLE_FIXED_TYPE(BOOL, Bool, bool);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64 val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32 tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}